

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewUninitMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  pointer __p;
  size_t sVar1;
  StringRef SVar2;
  StringRef local_1a8;
  pointer local_198;
  MemBuffer *Ret;
  char *Buf;
  char *pcStack_180;
  undefined4 local_16c;
  pointer local_168;
  char *Mem;
  size_t RealLen;
  size_t AlignedStringLen;
  undefined1 auStack_140 [8];
  StringRef NameRef;
  SmallString<256U> NameBuf;
  Twine *BufferName_local;
  size_t Size_local;
  
  SmallString<256U>::SmallString((SmallString<256U> *)&NameRef.Length);
  SVar2 = Twine::toStringRef(BufferName,(SmallVectorImpl<char> *)&NameRef.Length);
  NameRef.Data = (char *)SVar2.Length;
  auStack_140 = (undefined1  [8])SVar2.Data;
  sVar1 = StringRef::size((StringRef *)auStack_140);
  RealLen = alignTo(sVar1 + 0x19,0x10,0);
  Mem = (char *)(RealLen + Size + 1);
  local_168 = (pointer)operator_new((ulong)Mem,(nothrow_t *)&std::nothrow);
  if (local_168 == (pointer)0x0) {
    std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::WritableMemoryBuffer>,void>
              ((unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>
                *)this,(nullptr_t)0x0);
  }
  else {
    Buf = (char *)auStack_140;
    pcStack_180 = NameRef.Data;
    SVar2.Length = (size_t)NameRef.Data;
    SVar2.Data = (char *)auStack_140;
    CopyStringRef((char *)(local_168 + 1),SVar2);
    __p = local_168;
    Ret = (MemBuffer *)((long)&(local_168->super_MemoryBuffer)._vptr_MemoryBuffer + RealLen);
    *(char *)((long)&(Ret->super_WritableMemoryBuffer).super_MemoryBuffer._vptr_MemoryBuffer + Size)
         = '\0';
    StringRef::StringRef(&local_1a8,(char *)Ret,Size);
    anon_unknown.dwarf_36755e5::MemoryBufferMem<llvm::WritableMemoryBuffer>::MemoryBufferMem
              ((MemoryBufferMem<llvm::WritableMemoryBuffer> *)__p,local_1a8,true);
    local_198 = __p;
    std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::WritableMemoryBuffer>,void>
              ((unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>
                *)this,__p);
  }
  local_16c = 1;
  SmallString<256U>::~SmallString((SmallString<256U> *)&NameRef.Length);
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewUninitMemBuffer(size_t Size, const Twine &BufferName) {
  using MemBuffer = MemoryBufferMem<WritableMemoryBuffer>;
  // Allocate space for the MemoryBuffer, the data and the name. It is important
  // that MemoryBuffer and data are aligned so PointerIntPair works with them.
  // TODO: Is 16-byte alignment enough?  We copy small object files with large
  // alignment expectations into this buffer.
  SmallString<256> NameBuf;
  StringRef NameRef = BufferName.toStringRef(NameBuf);
  size_t AlignedStringLen = alignTo(sizeof(MemBuffer) + NameRef.size() + 1, 16);
  size_t RealLen = AlignedStringLen + Size + 1;
  char *Mem = static_cast<char*>(operator new(RealLen, std::nothrow));
  if (!Mem)
    return nullptr;

  // The name is stored after the class itself.
  CopyStringRef(Mem + sizeof(MemBuffer), NameRef);

  // The buffer begins after the name and must be aligned.
  char *Buf = Mem + AlignedStringLen;
  Buf[Size] = 0; // Null terminate buffer.

  auto *Ret = new (Mem) MemBuffer(StringRef(Buf, Size), true);
  return std::unique_ptr<WritableMemoryBuffer>(Ret);
}